

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SliceStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicestatic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3e3) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3e3;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0xa0);
    SliceStaticLayerParams::SliceStaticLayerParams(this_00.slicestatic_);
    (this->layer_).slicestatic_ = (SliceStaticLayerParams *)this_00;
  }
  return (SliceStaticLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceStaticLayerParams* NeuralNetworkLayer::mutable_slicestatic() {
  if (!has_slicestatic()) {
    clear_layer();
    set_has_slicestatic();
    layer_.slicestatic_ = new ::CoreML::Specification::SliceStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceStatic)
  return layer_.slicestatic_;
}